

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Keyword.cpp
# Opt level: O2

void __thiscall ninx::lexer::token::Keyword::Keyword(Keyword *this,int line_number,string *keyword)

{
  mapped_type mVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  
  (this->super_Token).line_number = line_number;
  (this->super_Token)._vptr_Token = (_func_int **)&PTR__Keyword_0014ed20;
  std::__cxx11::string::string((string *)&this->keyword,(string *)keyword);
  this->late = false;
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ninx::lexer::token::Type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ninx::lexer::token::Type>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ninx::lexer::token::Type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ninx::lexer::token::Type>_>_>
                   *)RESERVED_KEYWORDS_abi_cxx11_,keyword);
  if (sVar2 == 0) {
    mVar1 = FUNCNAME;
  }
  else {
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ninx::lexer::token::Type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ninx::lexer::token::Type>_>_>
             ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ninx::lexer::token::Type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ninx::lexer::token::Type>_>_>
                   *)RESERVED_KEYWORDS_abi_cxx11_,keyword);
    mVar1 = *pmVar3;
  }
  this->type = mVar1;
  return;
}

Assistant:

ninx::lexer::token::Keyword::Keyword(int line_number, const std::string &keyword) : Token(line_number), keyword(keyword) {
    if (RESERVED_KEYWORDS.count(keyword) > 0) {  // The given keyword is a reserved one, get the corresponding Type
        this->type = RESERVED_KEYWORDS.at(keyword);
    }else{
        this->type = Type::FUNCNAME;  // If a keyword is not reserved, then it is a function call
    }
}